

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O3

void __thiscall discordpp::User::User(User *this,User *param_1)

{
  _Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_> _Var1;
  _Head_base<0UL,_bool_*,_false> _Var2;
  _Head_base<0UL,_int_*,_false> _Var3;
  _Head_base<0UL,_discordpp::Snowflake_*,_false> _Var4;
  _Head_base<0UL,_bool_*,_false> _Var5;
  _Head_base<0UL,_int_*,_false> _Var6;
  pointer *__ptr;
  
  _Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl =
       (param_1->id).t_._M_t.
       super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
       super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
       super__Head_base<0UL,_discordpp::Snowflake_*,_false>;
  if (_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl == (Snowflake *)0x0) {
    _Var4._M_head_impl = (Snowflake *)0x0;
  }
  else {
    _Var4._M_head_impl = (Snowflake *)operator_new(8);
    (_Var4._M_head_impl)->_value =
         *(uint64_t *)_Var1.super__Head_base<0UL,_discordpp::Snowflake_*,_false>._M_head_impl;
  }
  (this->id).t_._M_t.
  super___uniq_ptr_impl<discordpp::Snowflake,_std::default_delete<discordpp::Snowflake>_>._M_t.
  super__Tuple_impl<0UL,_discordpp::Snowflake_*,_std::default_delete<discordpp::Snowflake>_>.
  super__Head_base<0UL,_discordpp::Snowflake_*,_false> =
       (_Head_base<0UL,_discordpp::Snowflake_*,_false>)_Var4._M_head_impl;
  (this->id).s_ = (param_1->id).s_;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->username,&param_1->username);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->discriminator,&param_1->discriminator);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->avatar).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->avatar).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->avatar)._vptr_nullable_field = (_func_int **)&PTR_operator__0024a208;
  _Var2._M_head_impl =
       (param_1->bot).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->bot).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t
  .super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->bot).super_field<bool>.s_ = (param_1->bot).super_field<bool>.s_;
  (this->bot)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  _Var2._M_head_impl =
       (param_1->system).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->system).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>.
  _M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->system).super_field<bool>.s_ = (param_1->system).super_field<bool>.s_;
  (this->system)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  _Var2._M_head_impl =
       (param_1->mfa_enabled).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->mfa_enabled).super_field<bool>.t_._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = _Var5._M_head_impl;
  (this->mfa_enabled).super_field<bool>.s_ = (param_1->mfa_enabled).super_field<bool>.s_;
  (this->mfa_enabled)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->banner).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->banner).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->banner)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  _Var3._M_head_impl =
       (param_1->accent_color).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var6._M_head_impl = (int *)0x0;
  }
  else {
    _Var6._M_head_impl = (int *)operator_new(4);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->accent_color).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->accent_color).super_field<int>.s_ = (param_1->accent_color).super_field<int>.s_;
  (this->accent_color)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a300;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->locale).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->locale).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->locale)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a360;
  _Var2._M_head_impl =
       (param_1->verified).super_field<bool>.t_._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  if (_Var2._M_head_impl == (bool *)0x0) {
    _Var5._M_head_impl = (bool *)0x0;
  }
  else {
    _Var5._M_head_impl = (bool *)operator_new(1);
    *_Var5._M_head_impl = *_Var2._M_head_impl;
  }
  (this->verified).super_field<bool>.t_._M_t.super___uniq_ptr_impl<bool,_std::default_delete<bool>_>
  ._M_t.super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool>_>.
  super__Head_base<0UL,_bool_*,_false>._M_head_impl = _Var5._M_head_impl;
  (this->verified).super_field<bool>.s_ = (param_1->verified).super_field<bool>.s_;
  (this->verified)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a260;
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&(this->email).
              super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ,&(param_1->email).
               super_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
  (this->email)._vptr_nullable_omittable_field = (_func_int **)&PTR_operator__0024a2b0;
  _Var3._M_head_impl =
       (param_1->flags).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var6._M_head_impl = (int *)0x0;
  }
  else {
    _Var6._M_head_impl = (int *)operator_new(4);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->flags).super_field<int>.t_._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->flags).super_field<int>.s_ = (param_1->flags).super_field<int>.s_;
  (this->flags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
  _Var3._M_head_impl =
       (param_1->premium_type).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var6._M_head_impl = (int *)0x0;
  }
  else {
    _Var6._M_head_impl = (int *)operator_new(4);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->premium_type).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->premium_type).super_field<int>.s_ = (param_1->premium_type).super_field<int>.s_;
  (this->premium_type)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
  _Var3._M_head_impl =
       (param_1->public_flags).super_field<int>.t_._M_t.
       super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  if (_Var3._M_head_impl == (int *)0x0) {
    _Var6._M_head_impl = (int *)0x0;
  }
  else {
    _Var6._M_head_impl = (int *)operator_new(4);
    *_Var6._M_head_impl = *_Var3._M_head_impl;
  }
  (this->public_flags).super_field<int>.t_._M_t.
  super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = _Var6._M_head_impl;
  (this->public_flags).super_field<int>.s_ = (param_1->public_flags).super_field<int>.s_;
  (this->public_flags)._vptr_omittable_field = (_func_int **)&PTR_operator__0024a3a0;
  return;
}

Assistant:

User(
        field<Snowflake> id = uninitialized,
        field<std::string> username = uninitialized,
        field<std::string> discriminator = uninitialized,
        nullable_field<std::string> avatar = uninitialized,
        omittable_field<bool> bot = omitted,
        omittable_field<bool> system = omitted,
        omittable_field<bool> mfa_enabled = omitted,
        nullable_omittable_field<std::string> banner = omitted,
        nullable_omittable_field<int> accent_color = omitted,
        omittable_field<std::string> locale = omitted,
        omittable_field<bool> verified = omitted,
        nullable_omittable_field<std::string> email = omitted,
        omittable_field<int> flags = omitted,
        omittable_field<int> premium_type = omitted,
        omittable_field<int> public_flags = omitted
    ):
        id(id),
        username(username),
        discriminator(discriminator),
        avatar(avatar),
        bot(bot),
        system(system),
        mfa_enabled(mfa_enabled),
        banner(banner),
        accent_color(accent_color),
        locale(locale),
        verified(verified),
        email(email),
        flags(flags),
        premium_type(premium_type),
        public_flags(public_flags)
    {}